

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O0

bool __thiscall
crnlib::task_pool::queue_task(task_pool *this,task_callback_func pFunc,uint64 data,void *pData_ptr)

{
  bool bVar1;
  tsstack<crnlib::task_pool::task,_16U> *in_RCX;
  task *in_RDX;
  long in_RDI;
  task tsk;
  
  task::task((task *)&stack0xffffffffffffffb8);
  atomic_increment32((atomic32_t *)(in_RDI + 0x2a8));
  bVar1 = tsstack<crnlib::task_pool::task,_16U>::try_push(in_RCX,in_RDX);
  if (bVar1) {
    semaphore::release((semaphore *)in_RCX,(long)in_RDX);
  }
  else {
    atomic_increment32((atomic32_t *)(in_RDI + 0x2b0));
  }
  return bVar1;
}

Assistant:

bool task_pool::queue_task(task_callback_func pFunc, uint64 data, void* pData_ptr) {
  CRNLIB_ASSERT(pFunc);

  task tsk;
  tsk.m_callback = pFunc;
  tsk.m_data = data;
  tsk.m_pData_ptr = pData_ptr;
  tsk.m_flags = 0;

  atomic_increment32(&m_total_submitted_tasks);
  if (!m_task_stack.try_push(tsk)) {
    atomic_increment32(&m_total_completed_tasks);
    return false;
  }

  m_tasks_available.release(1);

  return true;
}